

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_resurrectunreachable(HSQUIRRELVM v)

{
  HSQUIRRELVM v_local;
  
  SQSharedState::ResurrectUnreachable(v->_sharedstate,v);
  return 0;
}

Assistant:

SQRESULT sq_resurrectunreachable(HSQUIRRELVM v)
{
#ifndef NO_GARBAGE_COLLECTOR
    _ss(v)->ResurrectUnreachable(v);
    return SQ_OK;
#else
    return sq_throwerror(v,_SC("sq_resurrectunreachable requires a garbage collector build"));
#endif
}